

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O1

bool __thiscall Polynom<Complex>::isOrdinal(Polynom<Complex> *this)

{
  Rational *this_00;
  Complex *pCVar1;
  compare_t cVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  bool local_d9;
  BigInteger local_d0;
  Complex local_b0;
  
  local_d9 = (this->m).N == 0;
  if (!local_d9) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      pCVar1 = (this->m).arr;
      this_00 = (Rational *)
                ((long)&(pCVar1->_re)._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar4);
      Rational::operator_cast_to_BigInteger(&local_d0,this_00);
      Complex::Complex(&local_b0,&local_d0);
      cVar2 = Rational::compare(this_00,&local_b0._re);
      bVar5 = true;
      if (cVar2 == CMP_EQUAL) {
        cVar2 = Rational::compare((Rational *)
                                  ((long)&(pCVar1->_im)._numerator.digits.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar4),
                                  &local_b0._im);
        bVar5 = cVar2 != CMP_EQUAL;
      }
      if (local_b0._im._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._im._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b0._im._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._im._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b0._re._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._re._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b0._re._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._re._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (bVar5) {
        return local_d9;
      }
      Rational::operator_cast_to_BigInteger
                ((BigInteger *)&local_b0,
                 (Rational *)
                 ((long)&(((this->m).arr)->_re)._numerator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      BigInteger::BigInteger(&local_d0,0);
      cVar2 = BigInteger::_compare((BigInteger *)&local_b0,&local_d0);
      if (local_d0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b0._re._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._re._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (cVar2 == CMP_LESS) {
        return local_d9;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x80;
      bVar5 = uVar3 < (this->m).N;
      local_d9 = !bVar5;
    } while (bVar5);
  }
  return local_d9;
}

Assistant:

bool Polynom<Field>::isOrdinal() const
{
    for(unsigned i = 0; i < m.width(); ++i)
    {
        if(m[0][i] != BigInteger(m[0][i]))
            return false;
        if(BigInteger(m[0][i]) < 0)
            return false;
    }
    return true;
}